

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::InvariantTriangleSetCase::compare
          (InvariantTriangleSetCase *this,
          vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *coordsA,
          vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *coordsB,
          int param_3)

{
  _Rb_tree_header *p_Var1;
  TestLog *pTVar2;
  pointer pVVar3;
  pointer pVVar4;
  pointer pVVar5;
  pointer pVVar6;
  pointer pVVar7;
  bool bVar8;
  uint uVar9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *pvVar12;
  long lVar13;
  _Rb_tree_header *p_Var14;
  Vector<tcu::Vector<float,_3>,_3> *b;
  ulong uVar15;
  _Link_type __x;
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  *this_00;
  long lVar16;
  bool bVar17;
  bool bVar18;
  TriangleSet trianglesB;
  TriangleSet trianglesA;
  char local_220 [16];
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  local_210;
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  local_1e0;
  undefined1 local_1b0 [8];
  float local_1a8;
  undefined8 local_1a4;
  float local_19c;
  _Base_ptr local_198;
  float local_190;
  undefined1 local_18c [84];
  ios_base local_138 [264];
  
  pTVar2 = ((this->super_PrimitiveSetInvarianceCase).super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
  pVVar3 = (coordsA->
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  pVVar4 = (coordsA->
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pVVar5 = (coordsB->
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  pVVar6 = (coordsB->
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1e0._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1e0._M_t._M_impl._0_1_ = 0;
  local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1e0._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_210._M_t._M_impl.super__Rb_tree_header._M_header;
  local_210._M_t._M_impl._0_1_ = 0;
  local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_210._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __x = (_Link_type)coordsA;
  local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar8 = true;
  do {
    bVar18 = bVar8;
    uVar15 = (long)pVVar5 - (long)pVVar6;
    if (bVar18) {
      uVar15 = (long)pVVar3 - (long)pVVar4;
    }
    this_00 = &local_210;
    if (bVar18) {
      this_00 = &local_1e0;
    }
    uVar9 = (int)(uVar15 >> 2) * -0x55555555;
    if (2 < (int)uVar9) {
      uVar15 = (ulong)uVar9 / 3;
      lVar16 = 0;
      do {
        pvVar12 = coordsB;
        if (bVar18) {
          pvVar12 = coordsA;
        }
        pVVar7 = (pvVar12->
                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar13 = lVar16 + 0x100000000 >> 0x20;
        local_19c = pVVar7[lVar13].m_data[2];
        local_1a4 = *(undefined8 *)pVVar7[lVar13].m_data;
        lVar13 = lVar16 + 0x200000000 >> 0x20;
        local_198 = *(_Base_ptr *)pVVar7[lVar13].m_data;
        local_190 = pVVar7[lVar13].m_data[2];
        local_1b0 = *(undefined1 (*) [8])pVVar7[lVar16 >> 0x20].m_data;
        local_1a8 = pVVar7[lVar16 >> 0x20].m_data[2];
        std::
        __insertion_sort<tcu::Vector<float,3>*,__gnu_cxx::__ops::_Iter_comp_iter<deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>>>
                  ((_Link_type)local_1b0,local_18c);
        __x = (_Link_type)local_1b0;
        std::
        set<tcu::Vector<tcu::Vector<float,_3>,_3>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
        ::insert(this_00,(value_type *)local_1b0);
        lVar16 = lVar16 + 0x300000000;
        uVar15 = uVar15 - 1;
      } while (uVar15 != 0);
    }
    bVar8 = false;
  } while (bVar18);
  p_Var1 = &local_1e0._M_t._M_impl.super__Rb_tree_header;
  bVar8 = true;
  p_Var10 = local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var11 = local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_210._M_t._M_impl.super__Rb_tree_header ||
      (_Rb_tree_header *)local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    do {
      p_Var14 = &local_210._M_t._M_impl.super__Rb_tree_header;
      bVar17 = (_Rb_tree_header *)p_Var11 == p_Var14;
      bVar18 = (_Rb_tree_header *)p_Var10 == p_Var1;
      if ((bVar18) || ((_Rb_tree_header *)p_Var11 == p_Var14)) {
LAB_01416dc0:
        local_1b0 = (undefined1  [8])pTVar2;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,
                   "Failure: triangle sets in two cases are not equal (when ignoring triangle and vertex order"
                   ,0x5a);
        local_220[0] = '\0';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,local_220,0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,")",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        if ((bVar18) ||
           ((!bVar17 &&
            (bVar8 = LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>
                     ::operator()((LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>
                                   *)(p_Var10 + 1),(Vector<tcu::Vector<float,_3>,_3> *)(p_Var11 + 1)
                                  ,b), !bVar8)))) {
          local_1b0 = (undefined1  [8])pTVar2;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"Note: e.g. triangle ",0x14);
          tcu::operator<<((ostream *)&local_1a8,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var11 + 1));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8," exists for second case but not for first",0x29);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        else {
          local_1b0 = (undefined1  [8])pTVar2;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"Note: e.g. triangle ",0x14);
          tcu::operator<<((ostream *)&local_1a8,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var10 + 1));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8," exists for first case but not for second",0x29);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        __x = (_Link_type)&std::__cxx11::ostringstream::VTT;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        bVar8 = false;
        break;
      }
      __x = (_Link_type)(p_Var11 + 1);
      bVar18 = tcu::Vector<tcu::Vector<float,_3>,_3>::operator==
                         ((Vector<tcu::Vector<float,_3>,_3> *)(p_Var10 + 1),
                          (Vector<tcu::Vector<float,_3>,_3> *)__x);
      if (!bVar18) {
        bVar18 = false;
        bVar17 = false;
        goto LAB_01416dc0;
      }
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
    } while (((_Rb_tree_header *)p_Var10 != p_Var1) ||
            ((_Rb_tree_header *)p_Var11 != &local_210._M_t._M_impl.super__Rb_tree_header));
  }
  std::
  _Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  ::_M_erase((_Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
              *)local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,__x);
  std::
  _Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  ::_M_erase((_Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
              *)local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,__x);
  return bVar8;
}

Assistant:

virtual bool compare (const vector<Vec3>& coordsA, const vector<Vec3>& coordsB, int) const
	{
		return compareTriangleSets(coordsA, coordsB, m_testCtx.getLog());
	}